

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_module.h
# Opt level: O0

longlong __thiscall
shift_window_transformer::StageModule<float>::parameterCount(StageModule<float> *this)

{
  size_type sVar1;
  reference ppSVar2;
  long lVar3;
  int local_1c;
  longlong lStack_18;
  int i;
  longlong ret;
  StageModule<float> *this_local;
  
  lStack_18 = PatchMerging<float>::parameterCount(&this->patch_partition);
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
            ::size(&this->layers);
    if (sVar1 <= (ulong)(long)local_1c) break;
    ppSVar2 = std::
              vector<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
              ::operator[](&this->layers,(long)local_1c);
    lVar3 = (**(code **)(*(long *)*ppSVar2 + 8))();
    lStack_18 = lVar3 + lStack_18;
    local_1c = local_1c + 1;
  }
  return lStack_18;
}

Assistant:

long long parameterCount() {
            long long ret = patch_partition.parameterCount();
            for (int i = 0; i < layers.size(); ++i) {
                ret += layers[i]->parameterCount();
            }
            return ret;
        }